

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

char * bc_file_get_contents(char *path,_Bool utf8,size_t *len,bc_error_t **err)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  bc_string_t *str;
  size_t len_00;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  bc_error_t *pbVar7;
  uint8_t *suffix;
  char buffer [1024];
  uint8_t local_438 [1032];
  
  if ((err == (bc_error_t **)0x0 || (len == (size_t *)0x0 || path == (char *)0x0)) ||
     (*err != (bc_error_t *)0x0)) {
    pcVar4 = (char *)0x0;
  }
  else {
    *len = 0;
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar4 = (char *)0x0;
      pbVar7 = bc_error_new_printf(BC_ERROR_FILE,"Failed to open file (%s): %s",path,pcVar6);
      *err = pbVar7;
    }
    else {
      str = bc_string_new();
      iVar2 = feof(__stream);
      if (iVar2 == 0) {
        do {
          len_00 = fread(local_438,1,0x400,__stream);
          suffix = local_438;
          if (((utf8) && (len_00 != 0)) && (str->len == 0)) {
            sVar3 = bc_utf8_skip_bom(local_438,len_00);
            len_00 = len_00 - sVar3;
            suffix = local_438 + sVar3;
          }
          *len = *len + len_00;
          bc_string_append_len(str,(char *)suffix,len_00);
          iVar2 = feof(__stream);
        } while (iVar2 == 0);
      }
      fclose(__stream);
      if ((!utf8) || (_Var1 = bc_utf8_validate_str(str), _Var1)) {
        pcVar4 = bc_string_free(str,false);
      }
      else {
        pcVar4 = (char *)0x0;
        pbVar7 = bc_error_new_printf(BC_ERROR_FILE,"File content is not valid UTF-8: %s",path);
        *err = pbVar7;
        bc_string_free(str,true);
      }
    }
  }
  return pcVar4;
}

Assistant:

char*
bc_file_get_contents(const char *path, bool utf8, size_t *len, bc_error_t **err)
{
    if (path == NULL || len == NULL || err == NULL || *err != NULL)
        return NULL;

    *len = 0;
    FILE *fp = fopen(path, "r");

    if (fp == NULL) {
        int tmp_errno = errno;
        *err = bc_error_new_printf(BC_ERROR_FILE,
            "Failed to open file (%s): %s", path, strerror(tmp_errno));
        return NULL;
    }

    bc_string_t *str = bc_string_new();
    char buffer[BC_FILE_CHUNK_SIZE];
    char *tmp;

    while (!feof(fp)) {
        size_t read_len = fread(buffer, sizeof(char), BC_FILE_CHUNK_SIZE, fp);

        tmp = buffer;

        if (utf8 && str->len == 0 && read_len > 0) {
            // skipping BOM before validation, for performance. should be safe
            // enough
            size_t skip = bc_utf8_skip_bom((uint8_t*) buffer, read_len);
            read_len -= skip;
            tmp += skip;
        }

        *len += read_len;
        bc_string_append_len(str, tmp, read_len);
    }
    fclose(fp);

    if (utf8 && !bc_utf8_validate_str(str)) {
        *err = bc_error_new_printf(BC_ERROR_FILE,
            "File content is not valid UTF-8: %s", path);
        bc_string_free(str, true);
        return NULL;
    }

    return bc_string_free(str, false);
}